

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pru_impl.cpp
# Opt level: O2

void __thiscall ui::Pru::Fetch(Pru *this)

{
  string *__lhs;
  string *__rhs;
  bool bVar1;
  long lVar2;
  path *__return_storage_ptr__;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  path local_230 [13];
  
  __lhs = &this->path_;
  std::operator+(&local_250,__lhs,"/name");
  std::ifstream::ifstream(local_230,(string *)&local_250,_S_in);
  std::operator>>((istream *)local_230,(string *)&this->name_);
  std::ifstream::~ifstream(local_230);
  std::__cxx11::string::~string((string *)&local_250);
  std::operator+(&local_250,__lhs,"/firmware");
  std::ifstream::ifstream(local_230,(string *)&local_250,_S_in);
  __rhs = &this->firmware_;
  std::operator>>((istream *)local_230,(string *)__rhs);
  std::ifstream::~ifstream(local_230);
  std::__cxx11::string::~string((string *)&local_250);
  std::operator+(&local_250,__lhs,"/state");
  std::ifstream::ifstream(local_230,(string *)&local_250,_S_in);
  std::operator>>((istream *)local_230,(string *)&this->state_);
  std::ifstream::~ifstream(local_230);
  std::__cxx11::string::~string((string *)&local_250);
  std::operator+(&local_250,"/lib/firmware/",__rhs);
  std::filesystem::__cxx11::path::path(local_230,&local_250,auto_format);
  bVar1 = std::filesystem::exists(local_230);
  std::filesystem::__cxx11::path::~path(local_230);
  std::__cxx11::string::~string((string *)&local_250);
  if (bVar1) {
    std::operator+(&local_250,"/lib/firmware/",__rhs);
    std::filesystem::__cxx11::path::path(local_230,&local_250,auto_format);
    lVar2 = std::filesystem::file_size(local_230);
    std::filesystem::__cxx11::path::~path(local_230);
    std::__cxx11::string::~string((string *)&local_250);
    if (lVar2 == 0) {
      std::operator+(&local_250," Warning: ",__rhs);
      std::operator+(&local_230[0]._M_pathname,&local_250," Empty");
      std::__cxx11::string::operator=((string *)&this->info_,(string *)local_230);
      std::__cxx11::string::~string((string *)local_230);
      __return_storage_ptr__ = (path *)&local_250;
    }
    else {
      __return_storage_ptr__ = local_230;
      std::operator+(&__return_storage_ptr__->_M_pathname," Loaded Firmware: ",__rhs);
      std::__cxx11::string::operator=((string *)&this->info_,(string *)__return_storage_ptr__);
    }
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  else {
    std::__cxx11::string::assign((char *)&this->info_);
  }
  return;
}

Assistant:

void Fetch() {
    std::ifstream(path_ + "/name") >> name_;
    std::ifstream(path_ + "/firmware") >> firmware_;
    std::ifstream(path_ + "/state") >> state_;
    if (std::filesystem::exists("/lib/firmware/" + firmware_)) {
      if (std::filesystem::file_size("/lib/firmware/" + firmware_) == 0) {
        info_ = " Warning: " + firmware_ + " Empty";
      } else {
        info_ = " Loaded Firmware: " + firmware_;
      }
    } else {
      info_ = " Firmware Not found / Not Supported";
    }
  }